

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O1

void dtrsm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  double *pdVar12;
  ulong uVar13;
  int i2;
  long lVar14;
  undefined4 in_register_00000084;
  double *pdVar15;
  uint info;
  ulong uVar16;
  double *pdVar17;
  uint uVar18;
  long lVar19;
  double dVar20;
  string local_a0;
  ulong local_80;
  double local_68;
  bool local_60;
  undefined7 uStack_5f;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  bool local_48;
  undefined7 uStack_47;
  double *local_40;
  char local_31;
  
  local_80 = CONCAT44(in_register_00000084,m);
  _local_50 = CONCAT44(uStack_4c,(int)CONCAT71(in_register_00000011,transa));
  local_68 = alpha;
  bVar2 = lsame(side,'L');
  _local_58 = CONCAT44(uStack_54,(int)CONCAT71(in_register_00000009,diag));
  local_31 = lsame(diag,'N');
  bVar3 = lsame(uplo,'U');
  uVar10 = local_80;
  _local_48 = CONCAT71(uStack_47,bVar3);
  _local_60 = CONCAT71(uStack_5f,bVar2);
  i2 = (int)local_80;
  local_40 = (double *)(ulong)(uint)n;
  iVar4 = i2;
  if ((bVar2) || (bVar2 = lsame(side,'R'), iVar4 = n, bVar2)) {
    if ((local_48 != false) || (bVar2 = lsame(uplo,'L'), bVar2)) {
      cVar1 = (char)local_50;
      bVar2 = lsame((char)local_50,'N');
      if (((bVar2) || (bVar2 = lsame(cVar1,'T'), bVar2)) || (bVar2 = lsame(cVar1,'C'), bVar2)) {
        cVar1 = (char)local_58;
        bVar2 = lsame((char)local_58,'U');
        if ((bVar2) || (bVar2 = lsame(cVar1,'N'), bVar2)) {
          if (i2 < 0) {
            info = 5;
          }
          else {
            if (-1 < (int)local_40) {
              iVar4 = i4_max(1,iVar4);
              uVar18 = 0;
              if (lda < iVar4) {
                info = 9;
              }
              else {
                iVar4 = i4_max(1,i2);
                info = 0xb;
                if (iVar4 <= ldb) {
                  info = uVar18;
                }
                uVar18 = (uint)(iVar4 <= ldb);
              }
              goto LAB_00216e04;
            }
            info = 6;
          }
        }
        else {
          info = 4;
        }
      }
      else {
        info = 3;
      }
    }
    else {
      info = 2;
    }
  }
  else {
    info = 1;
  }
  uVar18 = 0;
LAB_00216e04:
  if ((char)uVar18 == '\0') {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"DTRSM","");
    xerbla(&local_a0,info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((int)local_40 != 0) {
    if ((local_68 != 0.0) || (NAN(local_68))) {
      bVar2 = lsame((char)local_50,'N');
      if (local_60 == false) {
        if (bVar2) {
          if (local_48 == false) {
            if (0 < (int)local_40) {
              uVar5 = (ulong)local_40 & 0xffffffff;
              lVar8 = (long)ldb;
              uVar10 = uVar10 & 0xffffffff;
              pdVar12 = b + (uVar5 - 1) * lVar8;
              pdVar15 = b + lVar8 * uVar5;
              uVar16 = uVar5;
              do {
                if (0 < i2 && local_68 != 1.0) {
                  uVar7 = 0;
                  do {
                    pdVar12[uVar7] = pdVar12[uVar7] * local_68;
                    uVar7 = uVar7 + 1;
                  } while (uVar10 != uVar7);
                }
                uVar7 = uVar16 - 1;
                if ((long)uVar16 < (long)uVar5) {
                  pdVar17 = pdVar15;
                  uVar9 = uVar16;
                  do {
                    if (a[uVar7 * (long)lda + uVar9] != 0.0 && 0 < i2) {
                      uVar13 = 0;
                      do {
                        pdVar12[uVar13] =
                             pdVar12[uVar13] - a[uVar7 * (long)lda + uVar9] * pdVar17[uVar13];
                        uVar13 = uVar13 + 1;
                      } while (uVar10 != uVar13);
                    }
                    uVar9 = uVar9 + 1;
                    pdVar17 = pdVar17 + lVar8;
                  } while ((int)uVar9 != (int)local_40);
                }
                if ((local_31 != '\0') && (0 < i2)) {
                  dVar20 = a[(lda + 1) * (int)uVar7];
                  uVar9 = 0;
                  do {
                    pdVar12[uVar9] = pdVar12[uVar9] * (1.0 / dVar20);
                    uVar9 = uVar9 + 1;
                  } while (uVar10 != uVar9);
                }
                pdVar12 = pdVar12 + -lVar8;
                pdVar15 = pdVar15 + -lVar8;
                bVar2 = 1 < (long)uVar16;
                uVar16 = uVar7;
              } while (bVar2);
            }
          }
          else if (0 < (int)local_40) {
            uVar10 = uVar10 & 0xffffffff;
            uVar16 = 0;
            pdVar12 = b;
            do {
              if (0 < i2 && local_68 != 1.0) {
                uVar5 = 0;
                do {
                  pdVar12[uVar5] = pdVar12[uVar5] * local_68;
                  uVar5 = uVar5 + 1;
                } while (uVar10 != uVar5);
              }
              if (uVar16 != 0) {
                uVar5 = 0;
                pdVar15 = b;
                do {
                  if (a[uVar16 * (long)lda + uVar5] != 0.0 && 0 < i2) {
                    uVar7 = 0;
                    do {
                      pdVar12[uVar7] =
                           pdVar12[uVar7] - a[uVar16 * (long)lda + uVar5] * pdVar15[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (uVar10 != uVar7);
                  }
                  uVar5 = uVar5 + 1;
                  pdVar15 = pdVar15 + ldb;
                } while (uVar5 != uVar16);
              }
              if ((local_31 != '\0') && (0 < i2)) {
                dVar20 = a[(lda + 1) * (int)uVar16];
                uVar5 = 0;
                do {
                  pdVar12[uVar5] = pdVar12[uVar5] * (1.0 / dVar20);
                  uVar5 = uVar5 + 1;
                } while (uVar10 != uVar5);
              }
              uVar16 = uVar16 + 1;
              pdVar12 = pdVar12 + ldb;
            } while (uVar16 != ((ulong)local_40 & 0xffffffff));
          }
        }
        else if (local_48 == false) {
          if (0 < (int)local_40) {
            lVar8 = (long)ldb;
            uVar5 = (ulong)local_40 & 0xffffffff;
            uVar10 = uVar10 & 0xffffffff;
            pdVar12 = b + lVar8;
            uVar7 = 1;
            uVar16 = 0;
            do {
              if ((local_31 != '\0') && (0 < i2)) {
                dVar20 = a[(lda + 1) * (int)uVar16];
                uVar9 = 0;
                do {
                  b[uVar9] = b[uVar9] * (1.0 / dVar20);
                  uVar9 = uVar9 + 1;
                } while (uVar10 != uVar9);
              }
              uVar9 = uVar16 + 1;
              if (uVar9 < uVar5) {
                pdVar15 = pdVar12;
                uVar13 = uVar7;
                do {
                  dVar20 = a[uVar16 * (long)lda + uVar13];
                  if (dVar20 != 0.0 && 0 < i2) {
                    uVar11 = 0;
                    do {
                      pdVar15[uVar11] = b[uVar11] * -dVar20 + pdVar15[uVar11];
                      uVar11 = uVar11 + 1;
                    } while (uVar10 != uVar11);
                  }
                  uVar13 = uVar13 + 1;
                  pdVar15 = pdVar15 + lVar8;
                } while (uVar13 != uVar5);
              }
              if (0 < i2 && local_68 != 1.0) {
                uVar16 = 0;
                do {
                  b[uVar16] = b[uVar16] * local_68;
                  uVar16 = uVar16 + 1;
                } while (uVar10 != uVar16);
              }
              uVar7 = uVar7 + 1;
              b = b + lVar8;
              pdVar12 = pdVar12 + lVar8;
              uVar16 = uVar9;
            } while (uVar9 != uVar5);
          }
        }
        else if (0 < (int)local_40) {
          uVar5 = (ulong)((int)local_40 - 1);
          lVar8 = (long)ldb;
          uVar10 = uVar10 & 0xffffffff;
          pdVar12 = b + (((ulong)local_40 & 0xffffffff) - 1) * lVar8;
          uVar16 = (ulong)local_40 & 0xffffffff;
          do {
            uVar7 = uVar16 - 1;
            if ((local_31 != '\0') && (0 < i2)) {
              dVar20 = a[(lda + 1) * (int)uVar7];
              uVar9 = 0;
              do {
                pdVar12[uVar9] = pdVar12[uVar9] * (1.0 / dVar20);
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            if (1 < (long)uVar16) {
              uVar9 = 0;
              pdVar15 = b;
              do {
                dVar20 = a[uVar7 * (long)lda + uVar9];
                if (dVar20 != 0.0 && 0 < i2) {
                  uVar13 = 0;
                  do {
                    pdVar15[uVar13] = pdVar12[uVar13] * -dVar20 + pdVar15[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar10 != uVar13);
                }
                uVar9 = uVar9 + 1;
                pdVar15 = pdVar15 + lVar8;
              } while (uVar9 != uVar5);
            }
            if (0 < i2 && local_68 != 1.0) {
              uVar9 = 0;
              do {
                pdVar12[uVar9] = pdVar12[uVar9] * local_68;
                uVar9 = uVar9 + 1;
              } while (uVar10 != uVar9);
            }
            uVar5 = uVar5 - 1;
            pdVar12 = pdVar12 + -lVar8;
            bVar2 = 1 < (long)uVar16;
            uVar16 = uVar7;
          } while (bVar2);
        }
      }
      else if (bVar2) {
        if (local_48 == false) {
          if (0 < (int)local_40) {
            uVar10 = uVar10 & 0xffffffff;
            uVar16 = 0;
            pdVar12 = b;
            do {
              if (0 < i2 && local_68 != 1.0) {
                uVar5 = 0;
                do {
                  pdVar12[uVar5] = pdVar12[uVar5] * local_68;
                  uVar5 = uVar5 + 1;
                } while (uVar10 != uVar5);
              }
              if (0 < i2) {
                lVar8 = uVar16 * (long)ldb;
                uVar7 = 0;
                pdVar15 = pdVar12;
                uVar5 = uVar10;
                pdVar17 = a;
                do {
                  dVar20 = b[lVar8 + uVar7];
                  if ((dVar20 != 0.0) || (NAN(dVar20))) {
                    if (local_31 != '\0') {
                      b[lVar8 + uVar7] = dVar20 / a[(lda + 1) * (int)uVar7];
                    }
                    if ((long)uVar7 < (long)i2 + -1) {
                      uVar9 = 1;
                      do {
                        pdVar15[uVar9] = pdVar15[uVar9] - b[lVar8 + uVar7] * pdVar17[uVar9];
                        uVar9 = uVar9 + 1;
                      } while (uVar5 != uVar9);
                    }
                  }
                  uVar7 = uVar7 + 1;
                  pdVar17 = pdVar17 + (long)lda + 1;
                  pdVar15 = pdVar15 + 1;
                  uVar5 = uVar5 - 1;
                } while (uVar7 != uVar10);
              }
              uVar16 = uVar16 + 1;
              pdVar12 = pdVar12 + ldb;
            } while (uVar16 != ((ulong)local_40 & 0xffffffff));
          }
        }
        else if (0 < (int)local_40) {
          uVar16 = 0;
          pdVar12 = b;
          do {
            if (0 < i2 && local_68 != 1.0) {
              uVar5 = 0;
              do {
                pdVar12[uVar5] = pdVar12[uVar5] * local_68;
                uVar5 = uVar5 + 1;
              } while ((uVar10 & 0xffffffff) != uVar5);
            }
            if (0 < i2) {
              lVar6 = uVar16 * (long)ldb;
              uVar5 = (ulong)(i2 - 1);
              lVar8 = (long)i2;
              pdVar15 = a + ((long)i2 + -1) * (long)lda;
              do {
                lVar14 = lVar8 + -1;
                dVar20 = b[lVar6 + lVar8 + -1];
                if ((dVar20 != 0.0) || (NAN(dVar20))) {
                  if (local_31 != '\0') {
                    b[lVar6 + lVar14] = dVar20 / a[(lda + 1) * (int)lVar14];
                  }
                  if (1 < lVar8) {
                    uVar7 = 0;
                    do {
                      pdVar12[uVar7] = pdVar12[uVar7] - b[lVar6 + lVar14] * pdVar15[uVar7];
                      uVar7 = uVar7 + 1;
                    } while (uVar5 != uVar7);
                  }
                }
                uVar5 = uVar5 - 1;
                pdVar15 = pdVar15 + -(long)lda;
                bVar2 = 1 < lVar8;
                lVar8 = lVar14;
              } while (bVar2);
            }
            uVar16 = uVar16 + 1;
            pdVar12 = pdVar12 + ldb;
          } while (uVar16 != ((ulong)local_40 & 0xffffffff));
        }
      }
      else if (local_48 == false) {
        if (0 < (int)local_40) {
          lVar8 = (long)i2;
          uVar10 = (ulong)local_40 & 0xffffffff;
          local_40 = b + lVar8;
          uVar16 = 0;
          do {
            if (0 < i2) {
              lVar14 = uVar16 * (long)ldb;
              iVar4 = 0;
              lVar6 = lVar8;
              pdVar12 = local_40;
              pdVar15 = a + (lVar8 + -1) * (long)lda + lVar8;
              do {
                dVar20 = b[lVar14 + lVar6 + -1] * local_68;
                if (lVar6 < lVar8) {
                  lVar19 = 0;
                  do {
                    dVar20 = dVar20 - pdVar15[lVar19] * pdVar12[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (iVar4 != (int)lVar19);
                }
                lVar19 = lVar6 + -1;
                if (local_31 != '\0') {
                  dVar20 = dVar20 / a[(lda + 1) * (int)lVar19];
                }
                b[lVar14 + lVar19] = dVar20;
                pdVar12 = pdVar12 + -1;
                pdVar15 = pdVar15 + ~(long)lda;
                iVar4 = iVar4 + 1;
                bVar2 = 1 < lVar6;
                lVar6 = lVar19;
              } while (bVar2);
            }
            uVar16 = uVar16 + 1;
            local_40 = local_40 + ldb;
          } while (uVar16 != uVar10);
        }
      }
      else if (0 < (int)local_40) {
        uVar16 = 0;
        pdVar12 = b;
        do {
          if (0 < i2) {
            lVar8 = uVar16 * (long)ldb;
            uVar5 = 0;
            pdVar15 = a;
            do {
              dVar20 = b[lVar8 + uVar5] * local_68;
              if (uVar5 != 0) {
                uVar7 = 0;
                do {
                  dVar20 = dVar20 - pdVar15[uVar7] * pdVar12[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar5 != uVar7);
              }
              if (local_31 != '\0') {
                dVar20 = dVar20 / a[(lda + 1) * (int)uVar5];
              }
              b[lVar8 + uVar5] = dVar20;
              uVar5 = uVar5 + 1;
              pdVar15 = pdVar15 + lda;
            } while (uVar5 != (uVar10 & 0xffffffff));
          }
          uVar16 = uVar16 + 1;
          pdVar12 = pdVar12 + ldb;
        } while (uVar16 != ((ulong)local_40 & 0xffffffff));
      }
    }
    else if (0 < (int)local_40) {
      uVar16 = (ulong)local_40 & 0xffffffff;
      iVar4 = 0;
      do {
        if (0 < i2) {
          memset(b + iVar4,0,(uVar10 & 0xffffffff) << 3);
        }
        iVar4 = iVar4 + ldb;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
  }
  return;
}

Assistant:

void dtrsm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRSM solves A*X=alpha*B or X*A=alpha*B, for triangular A, rectangular B.
//
//  Discussion:
//
//    DTRSM solves one of the matrix equations
//      op( A )*X = alpha*B,   
//    or
//      X*op( A ) = alpha*B,
//    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//    The matrix X is overwritten on B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op( A ) appears on the left
//    or right of X as follows:
//    'L' or 'l': op( A )*X = alpha*B.
//    'R' or 'r': X*op( A ) = alpha*B.
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANSA, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  0 <= N.
//
//    Input, double ALPHA, the scalar alpha.  When alpha is
//    0.0 then A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K] where K is M when SIDE = 'L' or 'l'  
//    and K is N when SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
//    LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
//    then LDA must be at least max( 1, n ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array B must
//    contain the right-hand side matrix B, and on exit is
//    overwritten by the solution matrix X.
//
//    Input, int LDB, the first dimension of B as declared
//    in the calling program.  LDB must be at least max ( 1, M ).
//
{
  int i;
  int info;
  int j;
  int k;
  bool lside;
  bool nounit;
  int nrowa;
  double temp;
  bool upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;

  if ( ( ! lside ) && ( ! lsame ( side, 'R' ) ) )
  {
    info = 1;
  }
  else if ( ( ! upper ) && ( ! lsame ( uplo, 'L' ) ) )
  {
    info = 2;
  }
  else if ( ( ! lsame ( transa, 'N' ) ) && 
            ( ! lsame ( transa, 'T' ) ) && 
            ( ! lsame ( transa, 'C' ) ) )
  {
    info = 3;
  }
  else if ( ( ! lsame ( diag, 'U' ) ) && ( ! lsame ( diag, 'N' ) ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRSM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  and when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside ) 
  {
//
//  Form  B := alpha*inv( a )*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*inv( A' )*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = 0; k < i; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*inv( A ).
//
  else
  {
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
      else
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*inv( A' ).
//
    else
    {
      if ( upper )
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = 0; k < n; k++ )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}